

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  Builder target_00;
  RpcConnectionState *cap;
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook>_> MVar1;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  PromiseClient *this_local;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  this_local = this;
  cap = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                  ((Own<capnp::_::(anonymous_namespace)::RpcConnectionState> *)(in_RSI + 0x18));
  kj::Own<capnp::ClientHook>::operator*((Own<capnp::ClientHook> *)(in_RSI + 0x30));
  memcpy(&local_40,&target,0x28);
  target_00._builder.capTable = (CapTableBuilder *)uStack_38;
  target_00._builder.segment = (SegmentBuilder *)local_40;
  target_00._builder.data = (void *)local_30;
  target_00._builder.pointers = (WirePointer *)uStack_28;
  target_00._builder.dataSize = (undefined4)local_20;
  target_00._builder.pointerCount = local_20._4_2_;
  target_00._builder._38_2_ = local_20._6_2_;
  MVar1 = RpcConnectionState::writeTarget((RpcConnectionState *)this,(ClientHook *)cap,target_00);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }